

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::_::ForkBranchBase::~ForkBranchBase(ForkBranchBase *this)

{
  uint *puVar1;
  ForkBranchBase *pFVar2;
  ForkHubBase *node;
  ForkBranchBase ***pppFVar3;
  long in_FS_OFFSET;
  
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_0061fe08;
  if (this->prevPtr != (ForkBranchBase **)0x0) {
    pFVar2 = this->next;
    *this->prevPtr = pFVar2;
    pppFVar3 = &pFVar2->prevPtr;
    if (pFVar2 == (ForkBranchBase *)0x0) {
      pppFVar3 = &((this->hub).ptr)->tailBranch;
    }
    *pppFVar3 = this->prevPtr;
  }
  node = (this->hub).ptr;
  if (node != (ForkHubBase *)0x0) {
    (this->hub).ptr = (ForkHubBase *)0x0;
    puVar1 = &node->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      PromiseDisposer::dispose(&node->super_PromiseArenaMember);
    }
  }
  if (*(long *)(in_FS_OFFSET + -0x30) == 0) {
    return;
  }
  AsyncObject::failed();
}

Assistant:

ForkBranchBase::~ForkBranchBase() noexcept(false) {
  if (prevPtr != nullptr) {
    // Remove from hub's linked list of branches.
    *prevPtr = next;
    (next == nullptr ? hub->tailBranch : next->prevPtr) = prevPtr;
  }
}